

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

BatchedMatMulLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::BatchedMatMulLayerParams>
          (Arena *arena)

{
  BatchedMatMulLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (BatchedMatMulLayerParams *)operator_new(0x38);
    CoreML::Specification::BatchedMatMulLayerParams::BatchedMatMulLayerParams
              (this,(Arena *)0x0,false);
  }
  else {
    this = (BatchedMatMulLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x38,
                      (type_info *)&CoreML::Specification::BatchedMatMulLayerParams::typeinfo);
    CoreML::Specification::BatchedMatMulLayerParams::BatchedMatMulLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }